

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O1

DVector3 * __thiscall
AActor::PosRelative(DVector3 *__return_storage_ptr__,AActor *this,line_t *line)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = (this->__Pos).Y;
  dVar2 = (this->__Pos).Z;
  iVar4 = this->Sector->PortalGroup;
  iVar3 = line->frontsector->PortalGroup;
  dVar5 = 0.0;
  dVar6 = 0.0;
  if (iVar4 != iVar3) {
    iVar4 = iVar3 * Displacements.size + iVar4;
    dVar5 = Displacements.data.Array[iVar4].pos.X;
    dVar6 = Displacements.data.Array[iVar4].pos.Y;
  }
  __return_storage_ptr__->X = (this->__Pos).X + dVar5;
  __return_storage_ptr__->Y = dVar1 + dVar6;
  __return_storage_ptr__->Z = dVar2;
  return __return_storage_ptr__;
}

Assistant:

inline DVector3 AActor::PosRelative(line_t *line) const
{
	return Pos() + Displacements.getOffset(Sector->PortalGroup, line->frontsector->PortalGroup);
}